

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::R_formatter<spdlog::details::scoped_padder>::format
          (R_formatter<spdlog::details::scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  scoped_padder p;
  size_t field_size;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffa4;
  memory_buf_t *in_stack_ffffffffffffffa8;
  padding_info *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  scoped_padder *in_stack_ffffffffffffffc0;
  memory_buf_t *in_stack_ffffffffffffffd0;
  int n;
  
  n = 0;
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  fmt_helper::pad2(n,in_stack_ffffffffffffffd0);
  uVar1 = CONCAT13(0x3a,(int3)in_stack_ffffffffffffffa0);
  ::fmt::v11::detail::buffer<char>::push_back
            ((buffer<char> *)CONCAT44(in_stack_ffffffffffffffa4,uVar1),in_stack_ffffffffffffff98);
  fmt_helper::pad2(n,in_stack_ffffffffffffffd0);
  scoped_padder::~scoped_padder((scoped_padder *)CONCAT44(in_stack_ffffffffffffffa4,uVar1));
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 5;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
    }